

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O3

void __thiscall QDialogPrivate::setDefault(QDialogPrivate *this,QPushButton *pushButton)

{
  QWidget *pQVar1;
  QWidget *this_00;
  Data *pDVar2;
  bool bVar3;
  QWidget *pQVar4;
  Data *pDVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QList<QPushButton_*> list;
  QArrayData *local_58;
  long lStack_50;
  ulong local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_58 = (QArrayData *)0x0;
  lStack_50 = 0;
  local_48 = 0;
  qt_qFindChildren_helper(pQVar1,0,0,&QPushButton::staticMetaObject,&local_58,1);
  if (local_48 == 0) {
    if (pushButton != (QPushButton *)0x0) goto LAB_004d82ba;
LAB_004d82e7:
    pDVar5 = (Data *)0x0;
  }
  else {
    uVar6 = 0;
    bVar3 = false;
    do {
      this_00 = *(QWidget **)(lStack_50 + uVar6 * 8);
      pQVar4 = QWidget::window(this_00);
      if (pQVar4 == pQVar1) {
        pDVar5 = (this->mainDef).wp.d;
        if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
          pQVar4 = (QWidget *)0x0;
        }
        else {
          pQVar4 = (QWidget *)(this->mainDef).wp.value;
        }
        if (pQVar4 == this_00) {
          bVar3 = true;
        }
        if (this_00 != (QWidget *)pushButton) {
          QPushButton::setDefault((QPushButton *)this_00,false);
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_48);
    if (pushButton == (QPushButton *)0x0) {
      if (bVar3) {
        QPushButton::setDefault((QPushButton *)(this->mainDef).wp.value,true);
        goto LAB_004d830d;
      }
      goto LAB_004d82e7;
    }
    if (bVar3) goto LAB_004d830d;
LAB_004d82ba:
    pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pushButton);
  }
  pDVar2 = (this->mainDef).wp.d;
  (this->mainDef).wp.d = pDVar5;
  (this->mainDef).wp.value = (QObject *)pushButton;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if (*(int *)pDVar2 == 0) {
      operator_delete(pDVar2);
    }
  }
LAB_004d830d:
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialogPrivate::setDefault(QPushButton *pushButton)
{
    Q_Q(QDialog);
    bool hasMain = false;
    QList<QPushButton*> list = q->findChildren<QPushButton*>();
    for (int i=0; i<list.size(); ++i) {
        QPushButton *pb = list.at(i);
        if (pb->window() == q) {
            if (pb == mainDef)
                hasMain = true;
            if (pb != pushButton)
                pb->setDefault(false);
        }
    }
    if (!pushButton && hasMain)
        mainDef->setDefault(true);
    if (!hasMain)
        mainDef = pushButton;
}